

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O2

void InterpreterThunkEmitter::FillBuffer
               (ThreadContextInfo *threadContext,bool asmJsThunk,intptr_t finalAddr,
               size_t bufferSize,BYTE *buffer,PRUNTIME_FUNCTION *pdataTableStart,
               intptr_t *epilogEndAddr,DWORD *thunkCount)

{
  BYTE *pdataBuffer;
  long epilogStart;
  bool bVar1;
  DWORD srcSize;
  DWORD DVar2;
  uintptr_t interpreterThunk;
  undefined4 *puVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  code *pcVar5;
  uint uVar6;
  uint uVar7;
  int value;
  long lVar8;
  BYTE *pBVar9;
  undefined1 local_158 [8];
  PrologEncoder prologEncoder;
  DWORD local_34;
  
  PrologEncoder::PrologEncoder((PrologEncoder *)local_158);
  local_34 = 0;
  lVar8 = 0;
  PrologEncoder::EncodeSmallProlog((PrologEncoder *)local_158,'<',0);
  srcSize = PrologEncoder::SizeOfPData((PrologEncoder *)local_158);
  if ((int)CONCAT71(in_register_00000031,asmJsThunk) == 0) {
    pcVar5 = Js::InterpreterStackFrame::InterpreterThunk;
  }
  else {
    pcVar5 = Js::InterpreterStackFrame::InterpreterAsmThunk;
  }
  interpreterThunk = ShiftAddr(threadContext,(uintptr_t)pcVar5);
  uVar7 = srcSize + 0xf & 0xfffffff0;
  uVar4 = (ulong)(0x1000 - uVar7);
  pdataBuffer = buffer + uVar4;
  epilogStart = (uVar4 - 0x10) + finalAddr;
  DVar2 = 0x48;
  js_memcpy_s(buffer,0x1000,(anonymous_namespace)::InterpreterThunk,0x48);
  EncodeInterpreterThunk(buffer,finalAddr,epilogStart,DVar2,interpreterThunk);
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar6 = 0xfa8 - uVar7;
  for (pBVar9 = buffer + 0x48; pBVar9 < buffer + (uVar4 - 0x18); pBVar9 = pBVar9 + 8) {
    js_memcpy_s(pBVar9,lVar8 + 0xfb8U & 0xffffffff,&(anonymous_namespace)::Call,8);
    value = ((int)lVar8 - uVar7) + 0xfa1;
    if (value < 0) {
      AssertCount = AssertCount + 1;
      prologEncoder._192_8_ = lVar8;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar1 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                         ,0x221,"(offset >= 0)","offset >= 0");
      if (!bVar1) goto LAB_00518d5f;
      *puVar3 = 0;
      lVar8 = prologEncoder._192_8_;
    }
    Emit<int>(pBVar9,3,value);
    local_34 = local_34 + 1;
    lVar8 = lVar8 + -8;
    uVar6 = uVar6 - 8;
  }
  Memory::CustomHeap::FillDebugBreak(pBVar9,(ulong)(((int)lVar8 + (0x1000 - uVar7)) - 0x58));
  DVar2 = CopyWithAlignment(buffer + ((ulong)uVar6 - lVar8) + 0x48,uVar7 + 0x10,
                            (BYTE *)&(anonymous_namespace)::Epilog,2,0x10);
  if (((uVar4 - uVar6) - (ulong)DVar2) + lVar8 != 0x48) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x237,"(pdataStart == currentBuffer)","pdataStart == currentBuffer");
    if (!bVar1) goto LAB_00518d5f;
    *puVar3 = 0;
  }
  uVar6 = (uVar7 + 0x10) - DVar2;
  if (uVar6 < srcSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar1 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x239,"(bytesRemaining >= pdataSize)","bytesRemaining >= pdataSize");
    if (!bVar1) {
LAB_00518d5f:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar3 = 0;
  }
  pBVar9 = PrologEncoder::Finalize
                     ((PrologEncoder *)local_158,buffer,((int)pdataBuffer - (int)buffer) - 0xe,
                      pdataBuffer);
  CopyWithAlignment(pdataBuffer,uVar6,pBVar9,srcSize,0x10);
  *pdataTableStart = (PRUNTIME_FUNCTION)(uVar4 + finalAddr);
  *epilogEndAddr = epilogStart;
  *thunkCount = local_34;
  return;
}

Assistant:

void InterpreterThunkEmitter::FillBuffer(
    _In_ ThreadContextInfo * threadContext,
    _In_ bool asmJsThunk,
    _In_ intptr_t finalAddr,
    _In_ size_t bufferSize,
    _Out_writes_bytes_all_(BlockSize) BYTE* buffer,
#if PDATA_ENABLED
    _Out_ PRUNTIME_FUNCTION * pdataTableStart,
    _Out_ intptr_t * epilogEndAddr,
#endif
    _Out_ DWORD * thunkCount
    )
{
#ifdef _M_X64
    PrologEncoder prologEncoder;
    prologEncoder.EncodeSmallProlog(PrologSize, StackAllocSize);
    DWORD pdataSize = prologEncoder.SizeOfPData();
#elif defined(_M_ARM32_OR_ARM64)
    DWORD pdataSize = sizeof(RUNTIME_FUNCTION);
#else
    DWORD pdataSize = 0;
#endif
    DWORD bytesRemaining = BlockSize;
    DWORD bytesWritten = 0;
    DWORD thunks = 0;
    DWORD epilogSize = sizeof(Epilog);
    const BYTE *epilog = Epilog;
    const BYTE *header = InterpreterThunk;

    intptr_t interpreterThunk;

    // the static interpreter thunk invoked by the dynamic emitted thunk
#ifdef ASMJS_PLAT
    if (asmJsThunk)
    {
        interpreterThunk = ShiftAddr(threadContext, &Js::InterpreterStackFrame::InterpreterAsmThunk);
    }
    else
#endif
    {
        interpreterThunk = ShiftAddr(threadContext, &Js::InterpreterStackFrame::InterpreterThunk);
    }


    BYTE * currentBuffer = buffer;
    // Ensure there is space for PDATA at the end
    BYTE* pdataStart = currentBuffer + (BlockSize - Math::Align(pdataSize, EMIT_BUFFER_ALIGNMENT));
    BYTE* epilogStart = pdataStart - Math::Align(epilogSize, EMIT_BUFFER_ALIGNMENT);

    // Ensure there is space for PDATA at the end
    intptr_t finalPdataStart = finalAddr + (BlockSize - Math::Align(pdataSize, EMIT_BUFFER_ALIGNMENT));
    intptr_t finalEpilogStart = finalPdataStart - Math::Align(epilogSize, EMIT_BUFFER_ALIGNMENT);

    // Copy the thunk buffer and modify it.
    js_memcpy_s(currentBuffer, bytesRemaining, header, HeaderSize);
    EncodeInterpreterThunk(currentBuffer, finalAddr, finalEpilogStart, epilogSize, interpreterThunk);
    currentBuffer += HeaderSize;
    bytesRemaining -= HeaderSize;

    // Copy call buffer
    DWORD callSize = sizeof(Call);
    while (currentBuffer < epilogStart - callSize)
    {
        js_memcpy_s(currentBuffer, bytesRemaining, Call, callSize);
#if _M_ARM
        int offset = (epilogStart - (currentBuffer + JmpOffset));
        Assert(offset >= 0);
        DWORD encodedOffset = EncoderMD::BranchOffset_T2_24(offset);
        DWORD encodedBranch = /*opcode=*/ 0x9000F000 | encodedOffset;
        Emit(currentBuffer, JmpOffset, encodedBranch);
#elif _M_ARM64
        int64 offset = (epilogStart - (currentBuffer + JmpOffset));
        Assert(offset >= 0);
        DWORD encodedOffset = EncoderMD::BranchOffset_26(offset);
        DWORD encodedBranch = /*opcode=*/ 0x14000000 | encodedOffset;
        Emit(currentBuffer, JmpOffset, encodedBranch);
#else
        // jump requires an offset from the end of the jump instruction.
        int offset = (int)(epilogStart - (currentBuffer + JmpOffset + sizeof(int)));
        Assert(offset >= 0);
        Emit(currentBuffer, JmpOffset, offset);
#endif
        currentBuffer += callSize;
        bytesRemaining -= callSize;
        thunks++;
    }

    // Fill any gap till start of epilog
    bytesWritten = FillDebugBreak(currentBuffer, (DWORD)(epilogStart - currentBuffer));
    bytesRemaining -= bytesWritten;
    currentBuffer += bytesWritten;

    // Copy epilog
    bytesWritten = CopyWithAlignment(currentBuffer, bytesRemaining, epilog, epilogSize, EMIT_BUFFER_ALIGNMENT);
    currentBuffer += bytesWritten;
    bytesRemaining -= bytesWritten;

    // Generate and register PDATA
#if PDATA_ENABLED
    BYTE* epilogEnd = epilogStart + epilogSize;
    DWORD functionSize = (DWORD)(epilogEnd - buffer);
    Assert(pdataStart == currentBuffer);
#ifdef _M_X64
    Assert(bytesRemaining >= pdataSize);
    BYTE* pdata = prologEncoder.Finalize(buffer, functionSize, pdataStart);
    bytesWritten = CopyWithAlignment(pdataStart, bytesRemaining, pdata, pdataSize, EMIT_BUFFER_ALIGNMENT);
#elif defined(_M_ARM32_OR_ARM64)
    RUNTIME_FUNCTION pdata;
    GeneratePdata(buffer, functionSize, &pdata);
    bytesWritten = CopyWithAlignment(pdataStart, bytesRemaining, (const BYTE*)&pdata, pdataSize, EMIT_BUFFER_ALIGNMENT);
#endif
    *pdataTableStart = (PRUNTIME_FUNCTION)finalPdataStart;
    *epilogEndAddr = finalEpilogStart;
#endif
    *thunkCount = thunks;
}